

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

string * __thiscall
cmOutputConverter::ConvertDirectorySeparatorsForShell_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,string_view source)

{
  pointer pcVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  bool bVar2;
  cmState *pcVar3;
  allocator<char> local_22;
  char local_21;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = source._M_str;
  local_20._M_len = source._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,&local_20,&local_22);
  pcVar3 = cmStateSnapshot::GetState(&this->StateSnapshot);
  bVar2 = cmState::UseMSYSShell(pcVar3);
  if ((((bVar2) && (this->LinkScriptShell == false)) &&
      (2 < __return_storage_ptr__->_M_string_length)) &&
     (pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p, pcVar1[1] == ':')) {
    pcVar1[1] = *pcVar1;
    *(__return_storage_ptr__->_M_dataplus)._M_p = '/';
  }
  pcVar3 = cmStateSnapshot::GetState(&this->StateSnapshot);
  bVar2 = cmState::UseWindowsShell(pcVar3);
  if (bVar2) {
    __first._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_22 = (allocator<char>)0x2f;
    local_21 = '\\';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(__first._M_current + __return_storage_ptr__->_M_string_length),
               (char *)&local_22,&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::ConvertDirectorySeparatorsForShell(
  cm::string_view source) const
{
  std::string result(source);
  // For the MSYS shell convert drive letters to posix paths, so
  // that c:/some/path becomes /c/some/path.  This is needed to
  // avoid problems with the shell path translation.
  if (this->GetState()->UseMSYSShell() && !this->LinkScriptShell) {
    if (result.size() > 2 && result[1] == ':') {
      result[1] = result[0];
      result[0] = '/';
    }
  }
  if (this->GetState()->UseWindowsShell()) {
    std::replace(result.begin(), result.end(), '/', '\\');
  }
  return result;
}